

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublylinkedlist.c
# Opt level: O1

PDLIST_ENTRY DList_RemoveHeadList(PDLIST_ENTRY ListHead)

{
  PDLIST_ENTRY pDVar1;
  DLIST_ENTRY_TAG *pDVar2;
  
  pDVar1 = ListHead->Flink;
  pDVar2 = pDVar1->Flink;
  ListHead->Flink = pDVar2;
  pDVar2->Blink = ListHead;
  return pDVar1;
}

Assistant:

PDLIST_ENTRY
DList_RemoveHeadList(
    PDLIST_ENTRY ListHead
)
{
    /* Codes_SRS_DLIST_06_012: [DList_RemoveHeadList removes the oldest entry from the list defined by the listHead parameter and returns a pointer to that entry.] */
    /* Codes_SRS_DLIST_06_013: [DList_RemoveHeadList shall return listHead if that's the only item in the list.] */

    PDLIST_ENTRY Flink;
    PDLIST_ENTRY Entry;

    Entry = ListHead->Flink;
    Flink = Entry->Flink;
    ListHead->Flink = Flink;
    Flink->Blink = ListHead;
    return Entry;
}